

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DInstance::createTexture(TextureGather2DInstance *this)

{
  ostringstream *this_00;
  pointer pPVar1;
  TextureGather2DInstance *pTVar2;
  TextureFormat TVar3;
  TextureFormat TVar4;
  int iVar5;
  deUint32 seed;
  Texture2D *pTVar6;
  long *plVar7;
  TextureBinding *this_01;
  Context *pCVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *access;
  long lVar10;
  void *__buf;
  SharedPtrStateBase *extraout_RDX;
  int levelNdx;
  long in_RSI;
  long lVar11;
  long lVar12;
  TextureBindingSp TVar13;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  TextureFormatInfo texFmtInfo;
  UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> local_4e0;
  string local_4d0;
  string local_4b0;
  TextureGather2DInstance *local_490;
  TextureFormat local_488;
  long local_480;
  long *local_478 [2];
  long local_468 [2];
  long *local_458 [2];
  long local_448 [2];
  Sampler local_434;
  LogImage local_3f8;
  TextureFormatInfo local_368;
  undefined8 local_328 [14];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [384];
  
  local_488 = *(TextureFormat *)(**(long **)(in_RSI + 8) + 0x10);
  local_490 = this;
  tcu::getTextureFormatInfo(&local_368,(TextureFormat *)(in_RSI + 0x218));
  pTVar6 = (Texture2D *)operator_new(0x50);
  tcu::Texture2D::Texture2D
            (pTVar6,(TextureFormat *)(in_RSI + 0x218),*(int *)(in_RSI + 0x264),
             *(int *)(in_RSI + 0x268));
  local_434._0_8_ = *(undefined8 *)(in_RSI + 0x224);
  local_434._12_8_ = *(undefined8 *)(in_RSI + 0x240);
  local_434.compare = *(CompareMode *)(in_RSI + 0x220);
  local_434.wrapR = REPEAT_GL;
  local_434.lodThreshold = 0.0;
  local_434.normalizedCoords = true;
  local_434.depthStencilMode = MODE_DEPTH;
  local_434._32_8_ = 0;
  local_434.borderColor.v._4_5_ = 0;
  local_434.borderColor.v.uData[2]._1_3_ = 0;
  local_434._48_5_ = 0;
  levelNdx = *(int *)(in_RSI + 0x248);
  iVar5 = (int)((long)(pTVar6->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar6->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
  local_4e0.m_data.ptr = pTVar6;
  if (levelNdx < iVar5) {
    lVar10 = (long)iVar5 - (long)levelNdx;
    lVar12 = (long)levelNdx * 0x28;
    do {
      local_480 = lVar10;
      tcu::Texture2D::allocLevel(local_4e0.m_data.ptr,levelNdx);
      pPVar1 = ((local_4e0.m_data.ptr)->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      seed = tcu::CommandLine::getBaseSeed(*(CommandLine **)(**(long **)(in_RSI + 8) + 0x18));
      access = (ConstPixelBufferAccess *)
               ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar12 + -8);
      fillWithRandomColorTiles
                ((PixelBufferAccess *)access,&local_368.valueMin,&local_368.valueMax,seed);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,levelNdx);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_458,0,(char *)0x0,0xb552e3);
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_4b0.field_2._M_allocated_capacity = *psVar9;
        local_4b0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_4b0.field_2._M_allocated_capacity = *psVar9;
        local_4b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_4b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      std::ostream::operator<<((ostringstream *)local_328,levelNdx);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
      std::ios_base::~ios_base(local_2b8);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_478,0,(char *)0x0,0xb552f5);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_4d0.field_2._M_allocated_capacity = *psVar9;
        local_4d0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_4d0.field_2._M_allocated_capacity = *psVar9;
        local_4d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_4d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::LogImage::LogImage
                (&local_3f8,&local_4b0,&local_4d0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      TVar3 = local_488;
      tcu::LogImage::write(&local_3f8,local_488.order,__buf,(size_t)access);
      TVar4 = local_488;
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_488.order = TVar3.order;
      local_488.type = TVar3.type;
      local_1b0._0_4_ = local_488.order;
      local_1b0._4_4_ = local_488.type;
      local_488 = TVar4;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Note: texture level\'s size is ",0x1e);
      local_328[0] = *(undefined8 *)
                      ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar12);
      tcu::operator<<((ostream *)this_00,(Vector<int,_2> *)local_328);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_description._M_dataplus._M_p != &local_3f8.m_description.field_2) {
        operator_delete(local_3f8.m_description._M_dataplus._M_p,
                        local_3f8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
        operator_delete(local_3f8.m_name._M_dataplus._M_p,
                        local_3f8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if (local_478[0] != local_468) {
        operator_delete(local_478[0],local_468[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      lVar10 = local_480;
      if (local_458[0] != local_448) {
        operator_delete(local_458[0],local_448[0] + 1);
      }
      levelNdx = levelNdx + 1;
      lVar12 = lVar12 + 0x28;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  pTVar6 = local_4e0.m_data.ptr;
  tcu::Texture2D::Texture2D
            ((Texture2D *)local_1b0,(TextureFormat *)local_4e0.m_data.ptr,
             (local_4e0.m_data.ptr)->m_width,(local_4e0.m_data.ptr)->m_height);
  tcu::Texture2D::operator=((Texture2D *)(in_RSI + 0x288),(Texture2D *)local_1b0);
  tcu::Texture3D::~Texture3D((Texture3D *)local_1b0);
  if (0 < (int)((ulong)((long)(pTVar6->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar6->super_TextureLevelPyramid).m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    lVar11 = 8;
    lVar12 = 0;
    lVar10 = 0;
    do {
      if (*(long *)((long)&((pTVar6->super_TextureLevelPyramid).m_data.
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11) != 0) {
        tcu::Texture2D::allocLevel((Texture2D *)(in_RSI + 0x288),(int)lVar10);
        swizzlePixels((PixelBufferAccess *)(*(long *)(in_RSI + 0x2a8) + lVar12),
                      (ConstPixelBufferAccess *)
                      ((long)(((pTVar6->super_TextureLevelPyramid).m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + lVar12 + -8),
                      (MaybeTextureSwizzle *)(in_RSI + 0x22c));
      }
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x28;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 < (int)((ulong)((long)(pTVar6->super_TextureLevelPyramid).m_access.
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pTVar6->super_TextureLevelPyramid).m_access.
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x33333333);
  }
  this_01 = (TextureBinding *)operator_new(0x68);
  pTVar6 = local_4e0.m_data.ptr;
  local_4e0.m_data.ptr = (Texture2D *)0x0;
  TextureBinding::TextureBinding(this_01,pTVar6,&local_434);
  pTVar2 = local_490;
  (local_490->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)0x0;
  (local_490->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  m_context = (Context *)0x0;
  (local_490->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)this_01;
  pCVar8 = (Context *)operator_new(0x20);
  *(undefined4 *)&pCVar8->m_platformInterface = 0;
  *(undefined4 *)((long)&pCVar8->m_platformInterface + 4) = 0;
  pCVar8->m_testCtx = (TestContext *)&PTR__SharedPtrState_00d5ad08;
  pCVar8->m_progCollection = (ProgramCollection<vk::ProgramBinary> *)this_01;
  (pTVar2->super_TextureGatherInstance).super_ShaderRenderCaseInstance.super_TestInstance.m_context
       = pCVar8;
  *(undefined4 *)&pCVar8->m_platformInterface = 1;
  *(undefined4 *)((long)&pCVar8->m_platformInterface + 4) = 1;
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::reset(&local_4e0);
  TVar13.m_state = extraout_RDX;
  TVar13.m_ptr = (TextureBinding *)pTVar2;
  return TVar13;
}

Assistant:

TextureBindingSp TextureGather2DInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2D>			texture		= MovePtr<tcu::Texture2D>(new tcu::Texture2D(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
			log << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
				<< TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}